

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# r_interpolate.cpp
# Opt level: O0

void __thiscall DPolyobjInterpolation::Serialize(DPolyobjInterpolation *this,FSerializer *arc)

{
  bool bVar1;
  uint amount;
  FSerializer *pFVar2;
  FSerializer *arc_local;
  DPolyobjInterpolation *this_local;
  
  DInterpolation::Serialize(&this->super_DInterpolation,arc);
  pFVar2 = FSerializer::operator()(arc,"poly",&this->poly);
  pFVar2 = FSerializer::operator()(pFVar2,"oldverts",&this->oldverts);
  pFVar2 = FSerializer::operator()(pFVar2,"oldcx",&this->oldcx);
  FSerializer::operator()(pFVar2,"oldcy",&this->oldcy);
  bVar1 = FSerializer::isReading(arc);
  if (bVar1) {
    amount = TArray<double,_double>::Size(&this->oldverts);
    TArray<double,_double>::Resize(&this->bakverts,amount);
  }
  return;
}

Assistant:

void DPolyobjInterpolation::Serialize(FSerializer &arc)
{
	Super::Serialize(arc);
	arc("poly", poly)
		("oldverts", oldverts)
		("oldcx", oldcx)
		("oldcy", oldcy);
	if (arc.isReading()) bakverts.Resize(oldverts.Size());
}